

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_getmetatable(lua_State *L,int idx)

{
  TValue *pTVar1;
  uint local_a4;
  ulong local_98;
  GCtab *mt;
  cTValue *o;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = index2adr(L,idx);
  if ((int)(pTVar1->field_4).it >> 0xf == -0xc) {
    local_98 = *(ulong *)((pTVar1->u64 & 0x7fffffffffff) + 0x20);
  }
  else if ((int)(pTVar1->field_4).it >> 0xf == -0xd) {
    local_98 = *(ulong *)((pTVar1->u64 & 0x7fffffffffff) + 0x20);
  }
  else {
    if ((uint)((int)(pTVar1->field_4).it >> 0xf) < 0xfffffff3) {
      local_a4 = 0xd;
    }
    else {
      local_a4 = (int)(pTVar1->field_4).it >> 0xf ^ 0xffffffff;
    }
    local_98 = *(ulong *)((L->glref).ptr64 + 0x1a8 + (ulong)(local_a4 + 0x16) * 8);
  }
  if (local_98 == 0) {
    L_local._4_4_ = 0;
  }
  else {
    L->top->u64 = local_98 | 0xfffa000000000000;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
      lj_state_growstack1(L);
    }
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

LUA_API int lua_getmetatable(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  GCtab *mt = NULL;
  if (tvistab(o))
    mt = tabref(tabV(o)->metatable);
  else if (tvisudata(o))
    mt = tabref(udataV(o)->metatable);
  else
    mt = tabref(basemt_obj(G(L), o));
  if (mt == NULL)
    return 0;
  settabV(L, L->top, mt);
  incr_top(L);
  return 1;
}